

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *
jsoncons::jsonpath::select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
          basic_path_node<char> *path)

{
  basic_path_node<char> *pbVar1;
  ulong uVar2;
  json_type jVar3;
  long lVar4;
  size_t sVar5;
  pointer ppbVar6;
  object_iterator oVar7;
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  nodes;
  allocator_type local_69;
  _Vector_base<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  local_68;
  undefined1 local_50 [16];
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_40;
  bool local_38;
  
  local_50._0_8_ = (value_type)0x0;
  std::
  vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
  ::vector((vector<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
            *)&local_68,path->size_,(value_type *)local_50,&local_69);
  lVar4 = (long)local_68._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68._M_impl.super__Vector_impl_data._M_start;
  for (; lVar4 = lVar4 + -8, path != (basic_path_node<char> *)0x0; path = path->parent_) {
    *(basic_path_node<char> **)((long)local_68._M_impl.super__Vector_impl_data._M_start + lVar4) =
         path;
  }
  ppbVar6 = local_68._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppbVar6 == local_68._M_impl.super__Vector_impl_data._M_finish) {
LAB_0031fa60:
      std::
      _Vector_base<const_jsoncons::jsonpath::basic_path_node<char>_*,_std::allocator<const_jsoncons::jsonpath::basic_path_node<char>_*>_>
      ::~_Vector_base(&local_68);
      return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root;
    }
    pbVar1 = *ppbVar6;
    if (pbVar1->node_kind_ == name) {
      jVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type(root);
      if (jVar3 == object_value) {
        local_50._0_8_ = (pbVar1->name_)._M_len;
        local_50._8_8_ = (pbVar1->name_)._M_str;
        oVar7 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                          ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root,
                           (string_view_type *)local_50);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                  ((object_range_type *)local_50,
                   (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)root);
        if ((((undefined1  [16])oVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
           ((local_38 & 1U) == 0)) {
          if (oVar7.has_value_ != local_38) goto LAB_0031fa4e;
        }
        else if (oVar7.it_._M_current._M_current != local_40._M_current) {
LAB_0031fa4e:
          root = &(oVar7.it_._M_current._M_current)->value_;
          goto LAB_0031fa55;
        }
      }
LAB_0031fa5e:
      root = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0;
      goto LAB_0031fa60;
    }
    if (pbVar1->node_kind_ == index) {
      jVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type(root);
      if ((jVar3 != array_value) ||
         (uVar2 = pbVar1->index_,
         sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(root),
         sVar5 <= uVar2)) goto LAB_0031fa5e;
      root = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       (root,pbVar1->index_);
    }
LAB_0031fa55:
    ppbVar6 = ppbVar6 + 1;
  } while( true );
}

Assistant:

Json* select(Json& root, const basic_path_node<typename Json::char_type>& path)
    {
        using path_node_type = basic_path_node<typename Json::char_type>;

        std::vector<const path_node_type*> nodes(path.size(), nullptr);
        std::size_t len = nodes.size();
        const path_node_type* p = std::addressof(path);
        while (p != nullptr)
        {
            nodes[--len] = p;
            p = p->parent();
        }

        Json* current = std::addressof(root);
        for (auto node : nodes)
        {
            if (node->node_kind() == path_node_kind::index)
            {
                if (current->type() != json_type::array_value || node->index() >= current->size())
                {
                    return nullptr; 
                }
                current = std::addressof(current->at(node->index()));
            }
            else if (node->node_kind() == path_node_kind::name)
            {
                if (current->type() != json_type::object_value)
                {
                    return nullptr;
                }
                auto it = current->find(node->name());
                if (it == current->object_range().end())
                {
                    return nullptr;
                }
                current = std::addressof((*it).value());
            }
        }
        return current;
    }